

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MedianFilterCV_8U.cpp
# Opt level: O3

uchar __thiscall MedianFilterCV_8U::getMedian(MedianFilterCV_8U *this,Mat *param_1,int y,int x)

{
  Mat *pMVar1;
  byte bVar2;
  long lVar3;
  int iVar4;
  int iVar5;
  long lVar6;
  uchar *puVar7;
  uchar __tmp;
  byte bVar8;
  uchar mergeResult [6];
  
  pMVar1 = this->sourceImage;
  lVar6 = (long)(y + -1);
  lVar3 = (long)x;
  this->firstTempArray[0] =
       *(uchar *)(lVar3 + -1 + **(long **)(pMVar1 + 0x48) * lVar6 + *(long *)(pMVar1 + 0x10));
  this->firstTempArray[1] =
       *(uchar *)(lVar3 + **(long **)(pMVar1 + 0x48) * lVar6 + *(long *)(pMVar1 + 0x10));
  this->firstTempArray[2] =
       *(uchar *)(lVar3 + 1 + lVar6 * **(long **)(pMVar1 + 0x48) + *(long *)(pMVar1 + 0x10));
  lVar6 = (long)y;
  this->secondTempArray[0] =
       *(uchar *)(lVar3 + -1 + **(long **)(pMVar1 + 0x48) * lVar6 + *(long *)(pMVar1 + 0x10));
  this->secondTempArray[1] =
       *(uchar *)(lVar3 + **(long **)(pMVar1 + 0x48) * lVar6 + *(long *)(pMVar1 + 0x10));
  this->secondTempArray[2] =
       *(uchar *)(lVar3 + 1 + **(long **)(pMVar1 + 0x48) * lVar6 + *(long *)(pMVar1 + 0x10));
  lVar6 = (long)(y + 1);
  this->thirdTempArray[0] =
       *(uchar *)(lVar3 + -1 + **(long **)(pMVar1 + 0x48) * lVar6 + *(long *)(pMVar1 + 0x10));
  this->thirdTempArray[1] =
       *(uchar *)(lVar3 + **(long **)(pMVar1 + 0x48) * lVar6 + *(long *)(pMVar1 + 0x10));
  this->thirdTempArray[2] =
       *(uchar *)(lVar3 + 1 + lVar6 * **(long **)(pMVar1 + 0x48) + *(long *)(pMVar1 + 0x10));
  lVar3 = 0;
  do {
    iVar5 = *(int *)((long)&this->pairsForSortThreeElements[0].first + lVar3);
    iVar4 = *(int *)((long)&this->pairsForSortThreeElements[0].second + lVar3);
    bVar8 = this->firstTempArray[iVar5];
    if (this->firstTempArray[iVar4] < bVar8) {
      this->firstTempArray[iVar5] = this->firstTempArray[iVar4];
      this->firstTempArray[iVar4] = bVar8;
    }
    lVar3 = lVar3 + 8;
  } while (lVar3 != 0x18);
  lVar3 = 0;
  do {
    iVar5 = *(int *)((long)&this->pairsForSortThreeElements[0].first + lVar3);
    iVar4 = *(int *)((long)&this->pairsForSortThreeElements[0].second + lVar3);
    bVar8 = this->secondTempArray[iVar5];
    if (this->secondTempArray[iVar4] < bVar8) {
      this->secondTempArray[iVar5] = this->secondTempArray[iVar4];
      this->secondTempArray[iVar4] = bVar8;
    }
    lVar3 = lVar3 + 8;
  } while (lVar3 != 0x18);
  lVar3 = 0;
  do {
    iVar5 = *(int *)((long)&this->pairsForSortThreeElements[0].first + lVar3);
    iVar4 = *(int *)((long)&this->pairsForSortThreeElements[0].second + lVar3);
    bVar8 = this->thirdTempArray[iVar5];
    if (this->thirdTempArray[iVar4] < bVar8) {
      this->thirdTempArray[iVar5] = this->thirdTempArray[iVar4];
      this->thirdTempArray[iVar4] = bVar8;
    }
    lVar3 = lVar3 + 8;
  } while (lVar3 != 0x18);
  lVar3 = 0;
  iVar5 = 0;
  iVar4 = 0;
  do {
    if (iVar5 == 3) {
      bVar8 = this->firstTempArray[iVar4];
LAB_00103228:
      iVar4 = iVar4 + 1;
    }
    else {
      if (iVar4 == 3) {
        bVar2 = this->secondTempArray[iVar5];
      }
      else {
        bVar8 = this->firstTempArray[iVar4];
        bVar2 = this->secondTempArray[iVar5];
        if (bVar8 < this->secondTempArray[iVar5]) goto LAB_00103228;
      }
      bVar8 = bVar2;
      iVar5 = iVar5 + 1;
    }
    mergeResult[lVar3] = bVar8;
    lVar3 = lVar3 + 1;
    if (lVar3 == 6) {
      iVar4 = 0;
      lVar3 = 5;
      iVar5 = 0;
      do {
        if ((iVar4 == 3) || ((iVar5 != 6 && (mergeResult[iVar5] < this->thirdTempArray[iVar4])))) {
          puVar7 = mergeResult + iVar5;
          iVar5 = iVar5 + 1;
        }
        else {
          puVar7 = this->thirdTempArray + iVar4;
          iVar4 = iVar4 + 1;
        }
        lVar3 = lVar3 + -1;
      } while (lVar3 != 0);
      return *puVar7;
    }
  } while( true );
}

Assistant:

uchar MedianFilterCV_8U::getMedian(const cv::Mat &, int y, int x) {
    initThreeAdjacentPixels(*sourceImage, firstTempArray, y - 1, x, true);
    initThreeAdjacentPixels(*sourceImage, secondTempArray, y, x, true);
    initThreeAdjacentPixels(*sourceImage, thirdTempArray, y + 1, x, true);

    sortThreeElements(firstTempArray);
    sortThreeElements(secondTempArray);
    sortThreeElements(thirdTempArray);

    uchar mergeResult[6];
    mergeTwoSortedArray(firstTempArray, 3, secondTempArray, 3, mergeResult);

    return getMedianOfTwoSortedArray(mergeResult, 6, thirdTempArray, 3);
}